

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionIDTests::TestfromString_SessionStringMissingColon_SessionNotPopulated::
TestfromString_SessionStringMissingColon_SessionNotPopulated
          (TestfromString_SessionStringMissingColon_SessionNotPopulated *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"fromString_SessionStringMissingColon_SessionNotPopulated",
             "SessionIDTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionIDTestCase.cpp"
             ,0x90);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031ee10;
  return;
}

Assistant:

TEST(fromString_SessionStringMissingColon_SessionNotPopulated)
{

  std::string sessionString = "FIX.4.2SENDER->TARGET";

  SessionID object;
  object.fromString(sessionString);

  CHECK_EQUAL("", object.getBeginString());
  CHECK_EQUAL("", object.getSenderCompID());
  CHECK_EQUAL("", object.getTargetCompID());
}